

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test264.c
# Opt level: O1

int main(int argc,char **argv)

{
  h264_macroblock *phVar1;
  int32_t (*paiVar2) [2];
  undefined4 *puVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  FILE *pFVar9;
  bitstream *pbVar10;
  h264_seqparm *phVar11;
  h264_picparm *phVar12;
  h264_slice *slice;
  h264_macroblock *phVar13;
  int32_t (*paaiVar14) [16] [16];
  int32_t (*paaiVar15) [8] [15];
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  uint32_t uVar20;
  uint32_t *puVar21;
  uint32_t *puVar22;
  uint32_t uVar23;
  uint32_t (*pauVar24) [4];
  int32_t (*paaiVar25) [4] [64];
  uint32_t *puVar26;
  ulong uVar27;
  int32_t *piVar28;
  uint32_t *puVar29;
  long lVar30;
  bool bVar31;
  uint uVar33;
  uint uVar34;
  undefined1 auVar32 [16];
  uint uVar35;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint32_t val;
  uint32_t local_8c;
  int32_t (*local_88) [16] [2];
  int32_t (*local_80) [8] [15];
  uint32_t local_74;
  int32_t (*local_70) [16] [16];
  int32_t *local_68;
  FILE *local_60;
  bitstream *local_58;
  uint32_t (*local_50) [4];
  uint32_t *local_48;
  h264_slice *local_40;
  int32_t *local_38;
  
  if (argc < 2) {
    pFVar9 = (FILE *)0x0;
  }
  else {
    pFVar9 = fopen(argv[1],"w");
    if (pFVar9 == (FILE *)0x0) {
      perror("fopen");
      return 1;
    }
  }
  pbVar10 = vs_new_encode(VS_H264);
  local_8c = 0xde;
  iVar8 = vs_start(pbVar10,&local_8c);
  iVar19 = 1;
  if (iVar8 == 0) {
    local_60 = pFVar9;
    local_58 = pbVar10;
    phVar11 = (h264_seqparm *)calloc(0xcd8,1);
    phVar12 = (h264_picparm *)calloc(0x8a8,1);
    slice = (h264_slice *)calloc(0xc48,1);
    phVar11->frame_mbs_only_flag = 0;
    phVar11->direct_8x8_inference_flag = 0;
    phVar12->num_slice_groups_minus1 = 0;
    phVar12->constrained_intra_pred_flag = 0;
    phVar12->transform_8x8_mode_flag = 1;
    phVar12->entropy_coding_mode_flag = 1;
    slice->seqparm = phVar11;
    slice->picparm = phVar12;
    slice->pic_size_in_mbs = 0xc0;
    slice->sliceqpy = 0x1a;
    slice->first_mb_in_slice = 0;
    slice->nal_unit_type = 1;
    slice->slice_type = 0;
    slice->mbaff_frame_flag = 0;
    slice->field_pic_flag = 1;
    slice->cabac_init_idc = 2;
    slice->num_ref_idx_l0_active_minus1 = 0x1f;
    slice->num_ref_idx_l1_active_minus1 = 0x1f;
    slice->chroma_array_type = 1;
    slice->bit_depth_luma_minus8 = 0;
    slice->bit_depth_chroma_minus8 = 0;
    slice->pic_width_in_mbs = 8;
    phVar13 = (h264_macroblock *)calloc(0x3774,0xc0);
    pbVar10 = local_58;
    slice->mbs = phVar13;
    auVar7 = _DAT_0010b100;
    auVar6 = _DAT_0010b0f0;
    auVar5 = _DAT_0010b0e0;
    local_74 = slice->mbaff_frame_flag;
    local_88 = phVar13->mvd;
    puVar21 = phVar13->rem_intra4x4_pred_mode;
    puVar22 = phVar13->pcm_sample_chroma;
    local_68 = phVar13->block_luma_ac[0][0] + 3;
    local_70 = phVar13->block_luma_4x4;
    paaiVar25 = phVar13->block_luma_8x8;
    uVar18 = 0;
    paaiVar15 = phVar13->block_chroma_ac;
    piVar28 = phVar13->mvd[0][0] + 1;
    do {
      local_38 = piVar28;
      local_80 = paaiVar15;
      uVar17 = (uint)uVar18;
      uVar4 = (uint)(uVar18 >> 2);
      phVar1 = phVar13 + uVar18;
      phVar13[uVar18].mb_field_decoding_flag = uVar4 & 1;
      phVar13[uVar18].coded_block_pattern = (uVar17 * 3) % 0x30;
      puVar29 = &phVar13[uVar18].transform_size_8x8_flag;
      phVar13[uVar18].transform_size_8x8_flag = uVar17 & 1;
      phVar13[uVar18].mb_qp_delta = (int)((uVar18 & 0xffffffff) / 5) * -5 + uVar17 + -2;
      if (uVar18 < 0x10) {
        phVar13[uVar18].mb_type = 0;
      }
      else if (uVar18 < 0x28) {
        phVar13[uVar18].mb_type = uVar17 - 0xf;
      }
      else if (uVar18 < 0x2c) {
LAB_001029a7:
        phVar13[uVar18].mb_type = 0x19;
      }
      else if (slice->slice_type == 1) {
        phVar13[uVar18].mb_type = 0x38;
      }
      else {
        if (slice->slice_type != 0) goto LAB_001029a7;
        if (uVar18 < 0x30) {
          phVar13[uVar18].mb_type = 0x20;
        }
        else if (uVar18 < 0x48) {
          uVar33 = (uint)(uVar18 - 0x30 >> 3) & 0x1fffffff;
          phVar13[uVar18].mb_type = uVar33 + 0x1b;
          if (uVar18 - 0x30 < 8) {
            uVar23 = (uVar17 & 7) + 0xf;
            pauVar24 = phVar13[uVar18].ref_idx;
            (*pauVar24)[0] = uVar23;
            (*pauVar24)[1] = uVar23;
            (*pauVar24)[2] = uVar23;
            (*pauVar24)[3] = uVar23;
            iVar8 = -3 - (uVar17 & 7);
            lVar16 = 0;
            do {
              paiVar2 = *local_88 + lVar16;
              (*paiVar2)[0] = iVar8;
              (*paiVar2)[1] = uVar17 & 3;
              paiVar2[1][0] = iVar8;
              paiVar2[1][1] = uVar17 & 3;
              lVar16 = lVar16 + 2;
            } while (lVar16 != 0x10);
          }
          else {
            pauVar24 = phVar13[uVar18].ref_idx;
            if (uVar33 == 1) {
              *(uint32_t *)((long)pauVar24 + 0) = 4;
              *(uint32_t *)((long)pauVar24 + 4) = 4;
              *(uint32_t *)((long)(phVar13[uVar18].ref_idx + 0) + 8) = 5;
              *(uint32_t *)((long)(phVar13[uVar18].ref_idx + 0) + 0xc) = 5;
              lVar16 = 0;
              uVar33 = 0;
              uVar34 = 1;
              do {
                paiVar2 = *local_88 + lVar16;
                *paiVar2 = (int32_t  [2])(CONCAT44(-(uVar33 >> 3),uVar33 >> 3) | 0xc);
                paiVar2[2][0] = uVar34 >> 3 | 0xc;
                paiVar2[2][1] = -(uVar34 >> 3);
                lVar16 = lVar16 + 2;
                uVar33 = uVar33 + 2;
                uVar34 = uVar34 + 2;
              } while (lVar16 != 0x10);
            }
            else {
              *(uint32_t *)((long)pauVar24 + 0) = 2;
              *(uint32_t *)((long)pauVar24 + 4) = 3;
              *(uint32_t *)((long)(phVar13[uVar18].ref_idx + 0) + 8) = 2;
              *(uint32_t *)((long)(phVar13[uVar18].ref_idx + 0) + 0xc) = 3;
              lVar16 = 0;
              uVar33 = 0;
              uVar34 = 1;
              do {
                paiVar2 = *local_88 + lVar16;
                (*paiVar2)[0] = uVar33 >> 2 | 6;
                (*paiVar2)[1] = -(uVar33 >> 2 & 1);
                paiVar2[1][0] = uVar34 >> 2 | 6;
                paiVar2[1][1] = -(uVar34 >> 2 & 1);
                lVar16 = lVar16 + 2;
                uVar33 = uVar33 + 2;
                uVar34 = uVar34 + 2;
              } while (lVar16 != 0x10);
            }
          }
        }
        else {
          phVar13[uVar18].mb_type = 0x1e;
          *puVar29 = 0;
          local_50 = phVar13[uVar18].ref_idx;
          lVar16 = 0;
          piVar28 = local_38;
          do {
            phVar1->sub_mb_type[lVar16] = (uint32_t)lVar16;
            lVar30 = lVar16 + 1;
            (*local_50)[lVar16] = (uint32_t)lVar30;
            uVar33 = (&DAT_0010b140)[lVar16];
            iVar8 = (uint32_t)lVar16 * 4;
            lVar16 = 0;
            do {
              uVar34 = uVar33 & (uint)lVar16;
              piVar28[lVar16 * 2 + -1] = uVar34 + iVar8 + 0x10;
              piVar28[lVar16 * 2] = uVar34 + iVar8 + -0x20;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 4);
            piVar28 = piVar28 + 8;
            lVar16 = lVar30;
            local_48 = puVar29;
            local_40 = slice;
          } while (lVar30 != 4);
        }
      }
      if ((phVar13[uVar18].mb_type == 0x1a) || (phVar13[uVar18].mb_type == 0)) {
        lVar16 = -0x10;
        uVar33 = 1;
        uVar34 = 3;
        uVar35 = 0;
        uVar37 = 1;
        uVar38 = 2;
        uVar39 = 3;
        do {
          puVar26 = puVar21 + lVar16;
          *puVar26 = 0;
          puVar26[1] = uVar33 & 1;
          puVar26[2] = 0;
          puVar26[3] = uVar34 & 1;
          puVar26 = puVar21 + lVar16 + 0x10;
          *puVar26 = uVar35 >> 1;
          puVar26[1] = uVar37 >> 1;
          puVar26[2] = uVar38 >> 1;
          puVar26[3] = uVar39 >> 1;
          uVar33 = uVar33 + 4;
          uVar34 = uVar34 + 4;
          uVar35 = uVar35 + 4;
          uVar37 = uVar37 + 4;
          uVar38 = uVar38 + 4;
          uVar39 = uVar39 + 4;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0);
        puVar26 = phVar13[uVar18].prev_intra8x8_pred_mode_flag;
        puVar26[0] = 0;
        puVar26[1] = 1;
        puVar26[2] = 0;
        puVar26[3] = 1;
        puVar26 = phVar13[uVar18].rem_intra8x8_pred_mode;
        *puVar26 = 0;
        puVar26[1] = 0;
        puVar26[2] = 1;
        puVar26[3] = 1;
      }
      uVar33 = phVar1->mb_type;
      if (uVar33 < 0x1b) {
        phVar1->intra_chroma_pred_mode = uVar4 & 3;
      }
      if (uVar33 == 0x19) {
        phVar1->coded_block_pattern = 0x2f;
        *puVar29 = 0;
        phVar13[uVar18].mb_qp_delta = 0;
        phVar13[uVar18].intra_chroma_pred_mode = 0;
        lVar16 = 0;
        do {
          if ((uVar18 & 1) != 0) {
            puVar22[lVar16] = (uint32_t)lVar16;
          }
          if ((uVar18 & 2) != 0) {
            puVar22[lVar16 + -0x100] = (uint32_t)lVar16;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x100);
      }
      else {
        puVar26 = &phVar13[uVar18].coded_block_pattern;
        if ((uVar33 == 0x38) || (uVar33 == 0x20)) {
          phVar1->mb_field_decoding_flag = 0;
          *puVar26 = 0;
          *puVar29 = 0;
          phVar13[uVar18].mb_qp_delta = 0;
          phVar13[uVar18].intra_chroma_pred_mode = 0;
        }
        else {
          if (uVar33 - 0x19 < 0xffffffe8) {
            if (phVar1->coded_block_pattern == 0) {
              phVar1->mb_qp_delta = 0;
            }
            iVar8 = 0;
            uVar27 = 0;
            paaiVar14 = local_70;
            do {
              if ((*puVar26 >> ((uint)(uVar27 >> 2) & 0x1f) & 1) != 0) {
                lVar16 = 0;
                do {
                  if (uVar27 != 0) {
                    iVar19 = iVar8 + (int)lVar16;
                    (*paaiVar14)[0][lVar16] = iVar19;
                    *(int *)((long)(*paaiVar25)[0] +
                            lVar16 * 4 +
                            ((ulong)(((uint)uVar27 & 3) << 6) | (uVar27 & 0xfffffffffffffffc) << 6))
                         = iVar19;
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 0x10);
              }
              uVar27 = uVar27 + 1;
              iVar8 = iVar8 + 0x10;
              paaiVar14 = (int32_t (*) [16] [16])(*paaiVar14 + 1);
            } while (uVar27 != 0x10);
          }
          else {
            uVar20 = (((int)(phVar13[uVar18].mb_type - 1) >> 2) % 3) * 0x10;
            uVar23 = uVar20 + 0xf;
            if ((int)phVar13[uVar18].mb_type < 0xd) {
              uVar23 = uVar20;
            }
            *puVar26 = uVar23;
            *puVar29 = 0;
            iVar8 = 0;
            uVar27 = 0;
            piVar28 = local_68;
            do {
              phVar13[uVar18].block_luma_dc[0][uVar27] = (uint)uVar27 | 0x100;
              if ((*puVar26 >> ((uint)(uVar27 >> 2) & 0x1f) & 1) != 0) {
                bVar31 = uVar27 != 0;
                lVar16 = 0;
                auVar40 = auVar6;
                auVar41 = auVar5;
                do {
                  auVar36 = auVar40 ^ auVar7;
                  auVar32 = auVar41 ^ auVar7;
                  iVar19 = (int)lVar16;
                  if ((auVar36._0_4_ < -0x7ffffff1 && auVar36._4_4_ == -0x80000000) && bVar31) {
                    piVar28[lVar16 + -3] = iVar19 + iVar8 + 1;
                  }
                  if ((auVar36._8_4_ < -0x7ffffff1 && auVar36._12_4_ == -0x80000000) && bVar31) {
                    piVar28[lVar16 + -2] = iVar19 + iVar8 + 2;
                  }
                  if ((auVar32._0_4_ < -0x7ffffff1 && auVar32._4_4_ == -0x80000000) && bVar31) {
                    piVar28[lVar16 + -1] = iVar19 + iVar8 + 3;
                  }
                  if ((auVar32._8_4_ < -0x7ffffff1 && auVar32._12_4_ == -0x80000000) && bVar31) {
                    piVar28[lVar16] = iVar19 + iVar8 + 4;
                  }
                  lVar16 = lVar16 + 4;
                  lVar30 = auVar40._8_8_;
                  auVar40._0_8_ = auVar40._0_8_ + 4;
                  auVar40._8_8_ = lVar30 + 4;
                  lVar30 = auVar41._8_8_;
                  auVar41._0_8_ = auVar41._0_8_ + 4;
                  auVar41._8_8_ = lVar30 + 4;
                } while (lVar16 != 0x10);
              }
              uVar27 = uVar27 + 1;
              iVar8 = iVar8 + 0x10;
              piVar28 = piVar28 + 0xf;
            } while (uVar27 != 0x10);
          }
          if ((*puVar26 & 0x30) != 0) {
            puVar3 = (undefined4 *)((long)phVar1->block_chroma_dc[0] + (ulong)((uVar17 & 1) << 5));
            *puVar3 = 0xfffffff0;
            puVar3[1] = 0xfffffff1;
            puVar3[2] = 0xfffffff2;
            puVar3[3] = 0xfffffff3;
          }
          if ((*puVar26 & 0x20) != 0) {
            paaiVar15 = local_80 + ((uint)(uVar18 >> 1) & 1);
            iVar8 = -0x1000;
            lVar16 = 0;
            do {
              lVar30 = 0;
              do {
                if (lVar16 != 1) {
                  (*paaiVar15)[0][lVar30] = iVar8 + (int)lVar30;
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 != 0xf);
              lVar16 = lVar16 + 1;
              paaiVar15 = (int32_t (*) [8] [15])(*paaiVar15 + 1);
              iVar8 = iVar8 + 0x100;
            } while (lVar16 != 4);
          }
        }
      }
      if (local_74 == 0) {
        phVar1->mb_field_decoding_flag = slice->field_pic_flag;
      }
      uVar18 = uVar18 + 1;
      local_88 = (int32_t (*) [16] [2])((long)(local_88 + 0x6e) + 0x74);
      puVar21 = puVar21 + 0xddd;
      puVar22 = puVar22 + 0xddd;
      local_68 = local_68 + 0xddd;
      local_70 = (int32_t (*) [16] [16])((long)(local_70 + 0xd) + 0x374);
      paaiVar25 = (int32_t (*) [4] [64])((long)(paaiVar25 + 0xd) + 0x374);
      paaiVar15 = (int32_t (*) [8] [15])((long)(local_80 + 0x1d) + 0x114);
      piVar28 = local_38 + 0xddd;
    } while (uVar18 != 0x60);
    slice->last_mb_in_slice = 0x5f;
    iVar8 = h264_slice_data(local_58,slice);
    iVar19 = 1;
    if (iVar8 == 0) {
      if (local_60 != (FILE *)0x0) {
        fwrite(pbVar10->bytes,(long)pbVar10->bytesnum,1,local_60);
      }
      pbVar10 = vs_new_decode(VS_H264,pbVar10->bytes,pbVar10->bytesnum);
      iVar8 = vs_start(pbVar10,&local_8c);
      if (iVar8 == 0) {
        if (local_8c == 0xde) {
          iVar8 = h264_slice_data(pbVar10,slice);
          h264_print_slice_data(slice);
          if (iVar8 == 0) {
            main_cold_2();
            iVar19 = 0;
          }
        }
        else {
          main_cold_1();
        }
      }
    }
  }
  return iVar19;
}

Assistant:

int main(int argc, char **argv) {
	FILE *out = 0;
	if (argc >= 2) {
		out = fopen(argv[1], "w");
		if (!out) {
			perror("fopen");
			return 1;
		}
	}
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;

	struct h264_seqparm *seqparm = calloc(sizeof *seqparm, 1);
	struct h264_picparm *picparm = calloc(sizeof *picparm, 1);
	struct h264_slice *slice = calloc(sizeof *slice, 1);
	seqparm->frame_mbs_only_flag = 0;
	seqparm->direct_8x8_inference_flag = 0;
	picparm->num_slice_groups_minus1 = 0;
	picparm->constrained_intra_pred_flag = 0;
	picparm->transform_8x8_mode_flag = 1;
	picparm->entropy_coding_mode_flag = 1;
	slice->seqparm = seqparm;
	slice->picparm = picparm;
	slice->sliceqpy = 26;
	slice->pic_width_in_mbs = 8;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * 24;
	slice->first_mb_in_slice = 0;
	slice->nal_unit_type = 1;
	slice->slice_type = H264_SLICE_TYPE_P;
	slice->mbaff_frame_flag = 0;
	slice->field_pic_flag = 1;
	slice->cabac_init_idc = 2;
	slice->chroma_array_type = 1;
	slice->num_ref_idx_l0_active_minus1 = 31;
	slice->num_ref_idx_l1_active_minus1 = 31;
	slice->bit_depth_luma_minus8 = 0;
	slice->bit_depth_chroma_minus8 = 0;
	slice->mbs = calloc(sizeof *slice->mbs, slice->pic_size_in_mbs);
	int i, j, k;
	for (i = 0; i < 96; i++) {
		slice->mbs[i].mb_field_decoding_flag = i >> 2 & 1;
		slice->mbs[i].coded_block_pattern = i * 3 % 48;
		slice->mbs[i].transform_size_8x8_flag = i& 1;
		slice->mbs[i].mb_qp_delta = (i%5) - 2;
		if (i < 16) {
			slice->mbs[i].mb_type = 0;
		} else if (i < 40) {
			slice->mbs[i].mb_type = 1 + (i- 16);
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_P) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_SKIP;
			} else if (i < 72) {
				int x = (i - 48)/8;
				slice->mbs[i].mb_type = H264_MB_TYPE_P_L0_16X16 + x;
				if (x == 0) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 15 + (i & 7);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = -((i & 7) + 3);
						slice->mbs[i].mvd[0][j][1] = (i&3);
					}
				} else if (x == 1) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 4 + (j >> 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 12 + (j >> 3);
						slice->mbs[i].mvd[0][j][1] = -(j >> 3);
					}
				} else if (x == 2) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 2 + (j & 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 6 + (j>>2 & 1);
						slice->mbs[i].mvd[0][j][1] = -(j>>2 & 1);
					}
				}
			} else {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_8X8;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 4; j++) {
					slice->mbs[i].sub_mb_type[j] = j;
					slice->mbs[i].ref_idx[0][j] = j+1;
					int tt[4] = { 0, 2, 1, 3};
					for (k = 0; k < 4; k++) {
						int kk = j * 4 + (k & j[tt]);
						slice->mbs[i].mvd[0][j*4+k][0] = 16+kk;
						slice->mbs[i].mvd[0][j*4+k][1] = kk - 32;;
					}
				}
			}
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_B) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else if (i < 72) {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			}
		} else {
			slice->mbs[i].mb_type = H264_MB_TYPE_I_PCM;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_I_NXN || slice->mbs[i].mb_type == H264_MB_TYPE_SI) {
			for (j = 0; j < 16; j++) {
				slice->mbs[i].prev_intra4x4_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra4x4_pred_mode[j] = j >> 1;
			}
			for (j = 0; j < 4; j++) {
				slice->mbs[i].prev_intra8x8_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra8x8_pred_mode[j] = j >> 1;
			}
		}
		if (slice->mbs[i].mb_type < H264_MB_TYPE_P_BASE) {
			slice->mbs[i].intra_chroma_pred_mode = i >> 2 & 3;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_P_SKIP || slice->mbs[i].mb_type == H264_MB_TYPE_B_SKIP) {
			slice->mbs[i].mb_field_decoding_flag = 0;
			slice->mbs[i].coded_block_pattern = 0;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
		} else if (slice->mbs[i].mb_type == H264_MB_TYPE_I_PCM) {
			slice->mbs[i].coded_block_pattern = 0x2f;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
			for (j = 0; j < 256; j++) {
				if (i & 1)
					slice->mbs[i].pcm_sample_chroma[j] = j;
				if (i & 2)
					slice->mbs[i].pcm_sample_luma[j] = j;
			}
		} else {
			if (h264_is_intra_16x16_mb_type(slice->mbs[i].mb_type)) {
				int mbt = slice->mbs[i].mb_type;
				int infer_cbp = (((mbt - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
				if (mbt >= H264_MB_TYPE_I_16X16_0_0_1)
					infer_cbp |= 0xf;
				slice->mbs[i].coded_block_pattern = infer_cbp;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 16; j++) {
					slice->mbs[i].block_luma_dc[0][j] = 0x100 + j;
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 15; k++) {
							if (j) {
								slice->mbs[i].block_luma_ac[0][j][k] = j * 16 + k + 1;
							}
						}
					}
				}
			} else {
				if (!slice->mbs[i].coded_block_pattern)
					slice->mbs[i].mb_qp_delta = 0;
				for (j = 0; j < 16; j++) {
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 16; k++) {
							if (j) {
								slice->mbs[i].block_luma_4x4[0][j][k] = j * 16 + k;
								slice->mbs[i].block_luma_8x8[0][j>>2][(j&3)*16+k] = j*16 + k;
							}
						}
					}
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x30) {
				for (k = 0; k < 4; k++) {
					slice->mbs[i].block_chroma_dc[i&1][k] = -0x10 + k;
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x20) {
				for (j = 0; j < 4; j++) {
					for (k = 0; k < 15; k++) {
						if (j != 1)
							slice->mbs[i].block_chroma_ac[i>>1&1][j][k] = k - 0x1000 + j * 0x100;
					}
				}
			}
		}
		if (!slice->mbaff_frame_flag)
			slice->mbs[i].mb_field_decoding_flag = slice->field_pic_flag;
	}
	slice->last_mb_in_slice = i - 1;
	
	if (h264_slice_data(str, slice)) return 1;

	if (out)
		fwrite(str->bytes, str->bytesnum, 1, out);

	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}
	if (h264_slice_data(nstr, slice)) {
		h264_print_slice_data(slice);
		return 1;
	}
	h264_print_slice_data(slice);

	fprintf (stderr, "All ok!\n");

	return 0;
}